

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_hash.cpp
# Opt level: O0

void duckdb::TemplatedLoopCombineHash<true,long>
               (Vector *input,Vector *hashes,SelectionVector *rsel,idx_t count)

{
  VectorType VVar1;
  unsigned_long *puVar2;
  hash_t hVar3;
  Vector *in_RSI;
  Vector *in_RDI;
  UnifiedVectorFormat *unaff_retaddr;
  idx_t in_stack_00000008;
  Vector *in_stack_00000010;
  unsigned_long constant_hash;
  UnifiedVectorFormat idata;
  hash_t other_hash;
  unsigned_long *hash_data;
  long *ldata;
  undefined8 in_stack_ffffffffffffff38;
  undefined1 is_null;
  UnifiedVectorFormat *in_stack_ffffffffffffff40;
  UnifiedVectorFormat *in_stack_ffffffffffffff50;
  Vector *in_stack_ffffffffffffff70;
  SelectionVector *in_stack_ffffffffffffff78;
  SelectionVector *in_stack_ffffffffffffff80;
  SelectionVector *in_stack_ffffffffffffff88;
  SelectionVector *in_stack_ffffffffffffff90;
  element_type *in_stack_ffffffffffffff98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffa0;
  ValidityMask *in_stack_ffffffffffffffb0;
  
  is_null = (undefined1)((ulong)in_stack_ffffffffffffff38 >> 0x38);
  VVar1 = Vector::GetVectorType(in_RDI);
  if ((VVar1 == CONSTANT_VECTOR) &&
     (VVar1 = Vector::GetVectorType(in_RSI), VVar1 == CONSTANT_VECTOR)) {
    ConstantVector::GetData<long>((Vector *)0x54b4be);
    puVar2 = ConstantVector::GetData<unsigned_long>((Vector *)0x54b4d3);
    ConstantVector::IsNull((Vector *)0x54b4f8);
    hVar3 = HashOp::Operation<long>((long)in_stack_ffffffffffffff40,(bool)is_null);
    hVar3 = CombineHashScalar(*puVar2,hVar3);
    *puVar2 = hVar3;
    return;
  }
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_ffffffffffffff50);
  Vector::ToUnifiedFormat(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  VVar1 = Vector::GetVectorType(in_RSI);
  if (VVar1 == CONSTANT_VECTOR) {
    puVar2 = ConstantVector::GetData<unsigned_long>((Vector *)0x54b588);
    Vector::SetVectorType(in_stack_ffffffffffffff70,(VectorType)(*puVar2 >> 0x38));
    UnifiedVectorFormat::GetData<long>((UnifiedVectorFormat *)&stack0xffffffffffffff80);
    FlatVector::GetData<unsigned_long>((Vector *)0x54b5c7);
    TightLoopCombineHashConstant<true,long>
              ((long *)in_stack_ffffffffffffffa0._M_pi,(hash_t)in_stack_ffffffffffffff98,
               (hash_t *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (idx_t)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffffb0)
    ;
  }
  else {
    in_stack_ffffffffffffff40 =
         (UnifiedVectorFormat *)
         UnifiedVectorFormat::GetData<long>((UnifiedVectorFormat *)&stack0xffffffffffffff80);
    FlatVector::GetData<unsigned_long>((Vector *)0x54b633);
    TightLoopCombineHash<true,long>
              ((long *)in_stack_ffffffffffffffa0._M_pi,(hash_t *)in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff90,(idx_t)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               (ValidityMask *)in_stack_ffffffffffffff78);
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_ffffffffffffff40);
  return;
}

Assistant:

void TemplatedLoopCombineHash(Vector &input, Vector &hashes, const SelectionVector *rsel, idx_t count) {
	if (input.GetVectorType() == VectorType::CONSTANT_VECTOR && hashes.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		auto ldata = ConstantVector::GetData<T>(input);
		auto hash_data = ConstantVector::GetData<hash_t>(hashes);

		auto other_hash = HashOp::Operation(*ldata, ConstantVector::IsNull(input));
		*hash_data = CombineHashScalar(*hash_data, other_hash);
	} else {
		UnifiedVectorFormat idata;
		input.ToUnifiedFormat(count, idata);
		if (hashes.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			// mix constant with non-constant, first get the constant value
			auto constant_hash = *ConstantVector::GetData<hash_t>(hashes);
			// now re-initialize the hashes vector to an empty flat vector
			hashes.SetVectorType(VectorType::FLAT_VECTOR);
			TightLoopCombineHashConstant<HAS_RSEL, T>(UnifiedVectorFormat::GetData<T>(idata), constant_hash,
			                                          FlatVector::GetData<hash_t>(hashes), rsel, count, idata.sel,
			                                          idata.validity);
		} else {
			D_ASSERT(hashes.GetVectorType() == VectorType::FLAT_VECTOR);
			TightLoopCombineHash<HAS_RSEL, T>(UnifiedVectorFormat::GetData<T>(idata),
			                                  FlatVector::GetData<hash_t>(hashes), rsel, count, idata.sel,
			                                  idata.validity);
		}
	}
}